

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O1

Top_dimensional_cells_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Top_dimensional_cells_iterator::
operator++(Top_dimensional_cells_iterator *__return_storage_ptr__,
          Top_dimensional_cells_iterator *this)

{
  pointer puVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer __s;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  puVar1 = (this->b->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->b->sizes).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2 & 0xffffffff;
  bVar9 = uVar6 == 0;
  if (!bVar9) {
    puVar2 = (this->counter).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*puVar2 == (ulong)(*puVar1 - 1)) {
      lVar8 = 0;
      do {
        bVar9 = uVar6 - 1 == lVar8;
        if (bVar9) goto LAB_00105601;
        lVar4 = lVar8 + 1;
        lVar7 = lVar8 + 1;
        lVar5 = lVar8 + 1;
        lVar8 = lVar7;
      } while (puVar2[lVar5] == (ulong)(puVar1[lVar4] - 1));
    }
    else {
      lVar7 = 0;
    }
    if (!bVar9) {
      __s = (this->counter).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
      puVar3 = __s + lVar7;
      *puVar3 = *puVar3 + 1;
      if (lVar7 != 0) {
        memset(__s,0,lVar7 << 3);
      }
      goto LAB_00105607;
    }
  }
LAB_00105601:
  puVar3 = (this->counter).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  *puVar3 = *puVar3 + 1;
LAB_00105607:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->counter,&this->counter);
  __return_storage_ptr__->b = this->b;
  return __return_storage_ptr__;
}

Assistant:

Top_dimensional_cells_iterator operator++() {
      // first find first element of the counter that can be increased:
      std::size_t dim = 0;
      while ((dim != this->b->dimension()) && (this->counter[dim] == this->b->sizes[dim] - 1)) ++dim;

      if (dim != this->b->dimension()) {
        ++this->counter[dim];
        for (std::size_t i = 0; i != dim; ++i) {
          this->counter[i] = 0;
        }
      } else {
        ++this->counter[0];
      }
      return *this;
    }